

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GroupFilterCase::iterate(GroupFilterCase *this)

{
  pointer pMVar1;
  pointer pMVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  string *desc;
  value_type *extraout_RDX;
  value_type *extraout_RDX_00;
  value_type *__value;
  uchar *puVar8;
  size_t tbslen;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  resMessages1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  resMessages0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  refMessages;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  resMessages2;
  ScopedLogSection section2;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filter2base;
  ScopedLogSection section1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filter1base;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filter0;
  MessageFilter baseFilter;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filter1full;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filter2full;
  undefined1 local_1c8 [32];
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_1a8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_188;
  undefined1 local_168 [40];
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_140;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_128;
  TestLog *local_108;
  ScopedLogSection local_100;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  local_f8;
  ScopedLogSection local_e0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  local_d8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  local_c0;
  undefined1 local_a8 [32];
  long local_88;
  undefined1 local_80;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  local_78;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  local_60;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_48;
  long lVar7;
  
  bVar3 = isKHRDebugSupported((this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase
                              .m_context);
  if (bVar3) {
    iVar4 = (*((this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase.m_context)->
              m_renderCtx->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var,iVar4);
    local_108 = ((this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase.
                 super_TestCase.super_TestNode.m_testCtx)->m_log;
    (**(code **)(lVar7 + 0x5e0))(0x92e0);
    (**(code **)(lVar7 + 0x5e0))(0x8242);
    (**(code **)(lVar7 + 0x420))(BaseCase::callbackHandle,this);
    tbslen = 1;
    (**(code **)(lVar7 + 0x428))(0x1100,0x1100,0x1100,0,0);
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Reference run","");
    desc = (string *)local_a8;
    FilterCase::genMessages(&local_140,&this->super_FilterCase,true,desc);
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    dVar5 = deStringHash((this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase.
                         super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
    uVar6 = tcu::CommandLine::getBaseSeed
                      (((this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase.
                        super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    local_a8._0_8_ = (pointer)0x110000001100;
    local_a8._8_4_ = 0x1100;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_a8 + 0x10),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
    local_80 = 1;
    __value = extraout_RDX;
    if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
      __value = extraout_RDX_00;
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
              *)local_1c8,(size_type)local_a8,__value,(allocator_type *)desc);
    uVar6 = uVar6 ^ dVar5;
    puVar8 = (uchar *)(ulong)uVar6;
    FilterCase::genFilters
              (&local_c0,&this->super_FilterCase,&local_140,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                *)local_1c8,uVar6,(int)tbslen);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               *)local_1c8);
    local_188.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FilterCase::applyFilters(&this->super_FilterCase,&local_c0);
    pMVar1 = (pointer)(local_1c8 + 0x10);
    local_1c8._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"Filtered run, default debug group","");
    FilterCase::genMessages
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                *)&local_d8,&this->super_FilterCase,false,(string *)local_1c8);
    local_168._16_8_ =
         local_188.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_168._8_8_ =
         local_188.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_168._0_8_ =
         local_188.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_188.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_d8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_188.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_d8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_188.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_d8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               *)local_168);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               *)&local_d8);
    if ((pointer)local_1c8._0_8_ != pMVar1) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    FilterCase::verify(&this->super_FilterCase,(EVP_PKEY_CTX *)&local_140,(uchar *)&local_188,
                       (size_t)&local_c0,puVar8,tbslen);
    puVar8 = (uchar *)(ulong)(uVar6 ^ 0xdeadbeef);
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    FilterCase::genFilters
              (&local_d8,&this->super_FilterCase,&local_140,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                *)local_1c8,uVar6 ^ 0xdeadbeef,(int)tbslen);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               *)local_1c8);
    join<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>
              (&local_78,&local_c0,&local_d8);
    local_1c8._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,0x1b3c1e9);
    pMVar2 = (pointer)(local_168 + 0x10);
    local_168._0_8_ = pMVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"Pushing Debug Group","");
    tcu::ScopedLogSection::ScopedLogSection
              (&local_e0,local_108,(string *)local_1c8,(string *)local_168);
    if ((pointer)local_168._0_8_ != pMVar2) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
    if ((pointer)local_1c8._0_8_ != pMVar1) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    local_1a8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(code **)(lVar7 + 0x1200))(0x824a,1,0xffffffff,"Test Group");
    FilterCase::applyFilters(&this->super_FilterCase,&local_d8);
    local_1c8._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"Filtered run, pushed one debug group","");
    FilterCase::genMessages
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                *)&local_f8,&this->super_FilterCase,false,(string *)local_1c8);
    local_168._16_8_ =
         local_1a8.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_168._8_8_ =
         local_1a8.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_168._0_8_ =
         local_1a8.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1a8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_f8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_1a8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_f8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_f8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               *)local_168);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               *)&local_f8);
    if ((pointer)local_1c8._0_8_ != pMVar1) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    FilterCase::verify(&this->super_FilterCase,(EVP_PKEY_CTX *)&local_140,(uchar *)&local_1a8,
                       (size_t)&local_78,puVar8,tbslen);
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    puVar8 = (uchar *)(ulong)(uVar6 ^ 0x43211234);
    FilterCase::genFilters
              (&local_f8,&this->super_FilterCase,&local_140,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                *)local_1c8,uVar6 ^ 0x43211234,(int)tbslen);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               *)local_1c8);
    join<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>
              (&local_60,&local_78,&local_f8);
    local_1c8._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,0x1b3c1e9);
    local_168._0_8_ = pMVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"Pushing Debug Group","");
    tcu::ScopedLogSection::ScopedLogSection
              (&local_100,local_108,(string *)local_1c8,(string *)local_168);
    if ((pointer)local_168._0_8_ != pMVar2) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
    if ((pointer)local_1c8._0_8_ != pMVar1) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    local_128.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(code **)(lVar7 + 0x1200))(0x824a,1,0xffffffff,"Nested Test Group");
    FilterCase::applyFilters(&this->super_FilterCase,&local_f8);
    local_1c8._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"Filtered run, pushed two debug groups","");
    FilterCase::genMessages(&local_48,&this->super_FilterCase,false,(string *)local_1c8);
    local_168._16_8_ =
         local_128.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_168._8_8_ =
         local_128.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_168._0_8_ =
         local_128.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_128.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_48.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_128.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_128.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               *)local_168);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&local_48);
    if ((pointer)local_1c8._0_8_ != pMVar1) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    FilterCase::verify(&this->super_FilterCase,(EVP_PKEY_CTX *)&local_140,(uchar *)&local_128,
                       (size_t)&local_60,puVar8,tbslen);
    (**(code **)(lVar7 + 0x1030))();
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&local_128);
    tcu::TestLog::endSection(local_100.m_log);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&local_60);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&local_f8);
    local_1c8._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"Filtered run, popped second debug group","");
    FilterCase::genMessages
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                *)&local_f8,&this->super_FilterCase,false,(string *)local_1c8);
    local_168._16_8_ =
         local_1a8.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_168._8_8_ =
         local_1a8.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_168._0_8_ =
         local_1a8.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1a8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_f8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_1a8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_f8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_f8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               *)local_168);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               *)&local_f8);
    if ((pointer)local_1c8._0_8_ != pMVar1) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    FilterCase::verify(&this->super_FilterCase,(EVP_PKEY_CTX *)&local_140,(uchar *)&local_1a8,
                       (size_t)&local_78,puVar8,tbslen);
    (**(code **)(lVar7 + 0x1030))();
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&local_1a8);
    tcu::TestLog::endSection(local_e0.m_log);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&local_78);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&local_d8);
    local_1c8._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"Filtered run, popped first debug group","");
    FilterCase::genMessages
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                *)&local_d8,&this->super_FilterCase,false,(string *)local_1c8);
    local_168._16_8_ =
         local_188.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_168._8_8_ =
         local_188.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_168._0_8_ =
         local_188.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_188.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_d8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_188.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_d8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_188.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_d8.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               *)local_168);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               *)&local_d8);
    if ((pointer)local_1c8._0_8_ != pMVar1) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    FilterCase::verify(&this->super_FilterCase,(EVP_PKEY_CTX *)&local_140,(uchar *)&local_188,
                       (size_t)&local_c0,puVar8,tbslen);
    uVar6 = (*((this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase.m_context)->
              m_renderCtx->_vptr_RenderContext[2])();
    if (((uVar6 >> 0xb & 1) == 0) &&
       (local_140.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_140.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_1c8._0_8_ = pMVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Verification accuracy is lacking without a debug context","");
      tcu::ResultCollector::addResult
                (&(this->super_FilterCase).super_BaseCase.m_results,QP_TEST_RESULT_QUALITY_WARNING,
                 (string *)local_1c8);
      if ((pointer)local_1c8._0_8_ != pMVar1) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&local_188);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&local_c0);
    if ((void *)local_a8._16_8_ != (void *)0x0) {
      operator_delete((void *)local_a8._16_8_,local_88 - local_a8._16_8_);
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&local_140);
    (**(code **)(lVar7 + 0x4e8))(0x92e0);
    (**(code **)(lVar7 + 0x420))(0,0);
    tcu::ResultCollector::setTestContextResult
              (&(this->super_FilterCase).super_BaseCase.m_results,
               (this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase.super_TestCase
               .super_TestNode.m_testCtx);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x4e9);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GroupFilterCase::IterateResult GroupFilterCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::TestLog&			log			= m_testCtx.getLog();

	gl.enable(GL_DEBUG_OUTPUT);
	gl.enable(GL_DEBUG_OUTPUT_SYNCHRONOUS);
	gl.debugMessageCallback(callbackHandle, this);

	try
	{
		gl.debugMessageControl(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, true);

		{

			// Generate reference (all errors)
			const vector<MessageData>	refMessages		= genMessages(true, "Reference run");
			const deUint32				baseSeed		= deStringHash(getName()) ^ m_testCtx.getCommandLine().getBaseSeed();
			const MessageFilter			baseFilter		 (GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, vector<GLuint>(), true);
			const vector<MessageFilter>	filter0			= genFilters(refMessages, vector<MessageFilter>(1, baseFilter), baseSeed, 4);
			vector<MessageData>			resMessages0;

			applyFilters(filter0);

			resMessages0 = genMessages(false, "Filtered run, default debug group");

			// Initial verification
			verify(refMessages, resMessages0, filter0);

			{
				// Generate reference (filters inherited from parent)
				const vector<MessageFilter> filter1base		= genFilters(refMessages, vector<MessageFilter>(), baseSeed ^ 0xDEADBEEF, 4);
				const vector<MessageFilter>	filter1full		= join(filter0, filter1base);
				tcu::ScopedLogSection		section1		(log, "", "Pushing Debug Group");
				vector<MessageData>			resMessages1;

				gl.pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 1, -1, "Test Group");
				applyFilters(filter1base);

				// First nested verification
				resMessages1 = genMessages(false, "Filtered run, pushed one debug group");
				verify(refMessages, resMessages1, filter1full);

				{
					// Generate reference (filters iherited again)
					const vector<MessageFilter>	filter2base		= genFilters(refMessages, vector<MessageFilter>(), baseSeed ^ 0x43211234, 4);
					const vector<MessageFilter>	filter2full		= join(filter1full, filter2base);
					tcu::ScopedLogSection		section2		(log, "", "Pushing Debug Group");
					vector<MessageData>			resMessages2;

					gl.pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 1, -1, "Nested Test Group");
					applyFilters(filter2base);

					// Second nested verification
					resMessages2 = genMessages(false, "Filtered run, pushed two debug groups");
					verify(refMessages, resMessages2, filter2full);

					gl.popDebugGroup();
				}

				// First restore verification
				resMessages1 = genMessages(false, "Filtered run, popped second debug group");
				verify(refMessages, resMessages1, filter1full);

				gl.popDebugGroup();
			}

			// restore verification
			resMessages0 = genMessages(false, "Filtered run, popped first debug group");
			verify(refMessages, resMessages0, filter0);

			if (!isDebugContext() && refMessages.empty())
				m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Verification accuracy is lacking without a debug context");
		}
	}
	catch (...)
	{
		gl.disable(GL_DEBUG_OUTPUT);
		gl.debugMessageCallback(DE_NULL, DE_NULL);
		throw;
	}

	gl.disable(GL_DEBUG_OUTPUT);
	gl.debugMessageCallback(DE_NULL, DE_NULL);
	m_results.setTestContextResult(m_testCtx);
	return STOP;
}